

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void gc_pose_compose(gc_pose *x1,gc_pose *x2,gc_pose *r)

{
  char *__assertion;
  uint __line;
  
  if (x1 == (gc_pose *)0x0) {
    __assertion = "x1";
    __line = 0xd;
  }
  else if (x2 == (gc_pose *)0x0) {
    __assertion = "x2";
    __line = 0xe;
  }
  else if (r == (gc_pose *)0x0) {
    __assertion = "r";
    __line = 0xf;
  }
  else if (x1 == r) {
    __assertion = "x1 != r";
    __line = 0x10;
  }
  else if (x2 == r) {
    __assertion = "x2 != r";
    __line = 0x11;
  }
  else if ((x1->rotation == (matrix3x3 *)0x0) || (x1->translation == (vector3 *)0x0)) {
    __assertion = "x1->rotation && x1->translation";
    __line = 0x12;
  }
  else if ((x2->rotation == (matrix3x3 *)0x0) || (x2->translation == (vector3 *)0x0)) {
    __assertion = "x2->rotation && x2->translation";
    __line = 0x13;
  }
  else {
    if ((r->rotation != (matrix3x3 *)0x0) && (r->translation != (vector3 *)0x0)) {
      la_dgemm_nnos(3,3,3,(double *)x1->rotation,3,(double *)x2->rotation,3,(double *)r->rotation,3)
      ;
      la_dgemv_toe(3,3,1.0,(double *)x2->rotation,3,(double *)x1->translation,1,1.0,
                   (double *)x2->translation,1,(double *)r->translation,1);
      return;
    }
    __assertion = "r->rotation && r->translation";
    __line = 0x14;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,__line,
                "void gc_pose_compose(const struct gc_pose *, const struct gc_pose *, struct gc_pose *)"
               );
}

Assistant:

void gc_pose_compose(
        const struct gc_pose *x1,
        const struct gc_pose *x2,
        struct gc_pose *r)
{
    assert(x1);
    assert(x2);
    assert(r);
    assert(x1 != r);
    assert(x2 != r);
    assert(x1->rotation && x1->translation);
    assert(x2->rotation && x2->translation);
    assert(r->rotation && r->translation);

    // E' = E_1 E_2
    la_dgemm_nnos(3, 3, 3,
            (double *)x1->rotation, 3,
            (double *)x2->rotation, 3,
            (double *)r->rotation, 3);

    // r' = r_2 + E_2^T r_1
    la_dgemv_toe(3, 3,
            1.0, (double *)x2->rotation, 3, (double *)x1->translation, 1,
            1.0, (double *)x2->translation, 1,
            (double *)r->translation, 1);
}